

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omplexer.cc
# Opt level: O0

void openmp__delete_buffer(YY_BUFFER_STATE b)

{
  YY_BUFFER_STATE local_20;
  YY_BUFFER_STATE b_local;
  
  if (b != (YY_BUFFER_STATE)0x0) {
    if (yy_buffer_stack == (YY_BUFFER_STATE *)0x0) {
      local_20 = (YY_BUFFER_STATE)0x0;
    }
    else {
      local_20 = yy_buffer_stack[yy_buffer_stack_top];
    }
    if (b == local_20) {
      yy_buffer_stack[yy_buffer_stack_top] = (YY_BUFFER_STATE)0x0;
    }
    if (b->yy_is_our_buffer != 0) {
      openmp_free(b->yy_ch_buf);
    }
    openmp_free(b);
  }
  return;
}

Assistant:

void yy_delete_buffer (YY_BUFFER_STATE  b )
{
    
	if ( ! b )
		return;

	if ( b == YY_CURRENT_BUFFER ) /* Not sure if we should pop here. */
		YY_CURRENT_BUFFER_LVALUE = (YY_BUFFER_STATE) 0;

	if ( b->yy_is_our_buffer )
		yyfree( (void *) b->yy_ch_buf  );

	yyfree( (void *) b  );
}